

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InstDebugPrintfPass::GenDebugStreamWrite
          (InstDebugPrintfPass *this,uint32_t shader_id,uint32_t instruction_idx_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *validation_ids,
          InstructionBuilder *builder)

{
  pointer puVar1;
  pointer puVar2;
  uint32_t result_type;
  uint32_t function;
  vector<unsigned_int,_std::allocator<unsigned_int>_> args;
  uint32_t local_50;
  uint32_t local_4c;
  undefined8 local_48;
  const_iterator cStack_40;
  undefined8 local_38;
  
  puVar1 = (validation_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  puVar2 = (validation_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
           .super__Vector_impl_data._M_start;
  local_48 = 0;
  cStack_40._M_current = (uint *)0x0;
  local_38 = 0;
  local_50 = shader_id;
  local_4c = instruction_idx_id;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,&local_50,&local_48);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,cStack_40,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(validation_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(validation_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  result_type = InstrumentPass::GetVoidId(&this->super_InstrumentPass);
  function = GetStreamWriteFunctionId(this,(uint32_t)((ulong)((long)puVar1 - (long)puVar2) >> 2));
  InstructionBuilder::AddFunctionCall
            (builder,result_type,function,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  return;
}

Assistant:

void InstDebugPrintfPass::GenDebugStreamWrite(
    uint32_t shader_id, uint32_t instruction_idx_id,
    const std::vector<uint32_t>& validation_ids, InstructionBuilder* builder) {
  // Call debug output function. Pass func_idx, instruction_idx and
  // validation ids as args.
  uint32_t val_id_cnt = static_cast<uint32_t>(validation_ids.size());
  std::vector<uint32_t> args = {shader_id, instruction_idx_id};
  (void)args.insert(args.end(), validation_ids.begin(), validation_ids.end());
  (void)builder->AddFunctionCall(GetVoidId(),
                                 GetStreamWriteFunctionId(val_id_cnt), args);
}